

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_u(bitstream *str,uint32_t *val,int size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int in_EDX;
  uint *in_RSI;
  int *in_RDI;
  int bit;
  int i;
  int in_stack_ffffffffffffffd8;
  int local_20;
  
  if (*in_RDI == 1) {
    *in_RSI = 0;
  }
  local_20 = 0;
  while( true ) {
    if (in_EDX <= local_20) {
      return 0;
    }
    uVar1 = *in_RSI >> (((char)in_EDX + -1) - (byte)local_20 & 0x1f);
    uVar2 = uVar1 & 1;
    iVar3 = vs_bit((bitstream *)(CONCAT44(uVar1,in_stack_ffffffffffffffd8) & 0x1ffffffff),
                   (uint32_t *)0x103f67);
    if (iVar3 != 0) break;
    *in_RSI = *in_RSI | uVar2 << (~(byte)local_20 + (char)in_EDX & 0x1f);
    in_stack_ffffffffffffffd8 = in_RDI[0xb];
    if (in_stack_ffffffffffffffd8 == 0) {
      if (0xe < in_RDI[10]) {
        fprintf(_stderr,"Too many zero bits in a row\n");
        return 1;
      }
    }
    else if ((in_stack_ffffffffffffffd8 == 2) && (0xf < in_RDI[10])) {
      fprintf(_stderr,"Too many zero bits in a row\n");
      return 1;
    }
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

int vs_u(struct bitstream *str, uint32_t *val, int size) {
	int i;
	int bit;
	if (str->dir == VS_DECODE)
		*val = 0;
	for (i = 0; i < size; i++) {
		bit = *val >> (size - 1 - i) & 1;
		if (vs_bit(str, &bit)) return 1;
		*val |= bit << (size - 1 - i);
		switch (str->type) {
			case VS_H261:
				if (str->zero_bits >= 15) {
					fprintf(stderr, "Too many zero bits in a row\n");
					return 1;
				}
				break;
			case VS_H263:
				if (str->zero_bits >= 16) {
					fprintf(stderr, "Too many zero bits in a row\n");
					return 1;
				}
				break;
			default:
				break;
		}
	}
	return 0;
}